

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

int vt_tag_cb(void *sysdata,void *userdata)

{
  int *piVar1;
  short *psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  prf_state_t *state;
  
  psVar2 = *(short **)((long)sysdata + 8);
  if ((*(byte *)(psVar2 + 2) & 1) == 0) {
    iVar6 = 1;
    if ((*psVar2 == 0x59) || (*psVar2 == 0x48)) {
      lVar3 = *(long *)(psVar2 + 4);
      uVar4 = (long)(int)((ushort)psVar2[1] - 4) / 4;
      uVar7 = 0;
      uVar5 = uVar4 & 0xffffffff;
      if ((int)uVar4 < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        piVar1 = (int *)((long)userdata + (ulong)*(uint *)(lVar3 + uVar7 * 4));
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  else {
    iVar6 = 2;
  }
  return iVar6;
}

Assistant:

static
int
vt_tag_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state = (prf_state_t *) sysdata;
    uint8_t * rlt = (uint8_t *) userdata;
    prf_node_t * node = state->node;

    if ( node->flags & PRF_NODE_DELETED )
        return PRF_TRAV_SIBLING;

    switch ( node->opcode ) {
    case 72: /* vertex list */
    case 89: /* morph vertex list */
        do {
            int i, num;
            uint32_t * data;
            data = (uint32_t *) node->data;
            num = (node->length - 4) / 4;
            for ( i = 0; i < num; i++ )
                ((uint32_t *)(rlt + data[i]))[0] += 1;
        } while ( FALSE );
        break;
    default:
        break;
    }
    return PRF_TRAV_CONTINUE;
}